

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testAlphabetPerTerritory(void)

{
  TerritoryAlphabets *pTVar1;
  TerritoryAlphabets *alphabetsForTerritory;
  Territory local_10;
  int j;
  int i;
  int nrTests;
  
  j = 0;
  for (local_10 = TERRITORY_VAT; local_10 < _TERRITORY_MAX; local_10 = local_10 + 1) {
    pTVar1 = getAlphabetsForTerritory(local_10);
    if ((pTVar1->count < 1) || (3 < pTVar1->count)) {
      foundError();
      printf("*** ERROR *** Bad getAlphabetsForTerritory(%d) count: %d\n",(ulong)(uint)local_10,
             (ulong)(uint)pTVar1->count);
    }
    for (alphabetsForTerritory._4_4_ = 0; j = j + 1,
        (int)alphabetsForTerritory._4_4_ < pTVar1->count;
        alphabetsForTerritory._4_4_ = alphabetsForTerritory._4_4_ + 1) {
      if ((pTVar1->alphabet[(int)alphabetsForTerritory._4_4_] < ALPHABET_ROMAN) ||
         (ALPHABET_GUJARATI < pTVar1->alphabet[(int)alphabetsForTerritory._4_4_])) {
        foundError();
        printf("*** ERROR *** Bad ALPHABETS_FOR_TERRITORY[%d].alphabet[%d]: %d\n",
               (ulong)(uint)local_10,(ulong)alphabetsForTerritory._4_4_,
               (ulong)(uint)pTVar1->alphabet[(int)alphabetsForTerritory._4_4_]);
      }
    }
  }
  return j;
}

Assistant:

static int testAlphabetPerTerritory(void) {
    int nrTests = 0;
    int i, j;
    for (i = _TERRITORY_MIN + 1; i < _TERRITORY_MAX; i++) {
        const TerritoryAlphabets *alphabetsForTerritory = getAlphabetsForTerritory((enum Territory) i);
        ++nrTests;
        if (alphabetsForTerritory->count < 1 || alphabetsForTerritory->count > MAX_ALPHABETS_PER_TERRITORY) {
            foundError();
            printf("*** ERROR *** Bad getAlphabetsForTerritory(%d) count: %d\n", i, alphabetsForTerritory->count);
        }
        for (j = 0; j < alphabetsForTerritory->count; j++) {
            ++nrTests;
            if (alphabetsForTerritory->alphabet[j] < 0 ||
                alphabetsForTerritory->alphabet[j] >= _ALPHABET_MAX) {
                foundError();
                printf("*** ERROR *** Bad ALPHABETS_FOR_TERRITORY[%d].alphabet[%d]: %d\n", i, j,
                       alphabetsForTerritory->alphabet[j]);
            }
        }
    }
    return nrTests;
}